

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

void __thiscall
SkylineBinPack::Insert
          (SkylineBinPack *this,TArray<RectSize,_RectSize> *rects,TArray<Rect,_Rect> *dst)

{
  DisjointRectCollection *this_00;
  Rect RVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *__assertion;
  ulong uVar6;
  uint local_74;
  uint local_70;
  int index;
  int score2;
  int score1;
  Rect local_60;
  TArray<Rect,_Rect> *local_50;
  Rect bestNode;
  
  local_50 = dst;
  TArray<Rect,_Rect>::Clear(dst);
  this_00 = &this->disjointRects;
  while( true ) {
    uVar3 = *(uint *)(rects + 0xc);
    if (uVar3 == 0) {
      return;
    }
    iVar4 = 0x7fffffff;
    local_74 = 0xffffffff;
    iVar5 = 0x7fffffff;
    local_70 = local_74;
    for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
      local_60 = FindPositionForNewNodeMinWaste
                           (this,*(int *)(*(long *)rects + uVar6 * 8),
                            *(int *)(*(long *)rects + 4 + uVar6 * 8),&score2,&score1,&index);
      bVar2 = DisjointRectCollection::Disjoint(this_00,&local_60);
      RVar1 = local_60;
      if (!bVar2) {
        __assertion = "disjointRects.Disjoint(newNode)";
        uVar3 = 0x49;
        goto LAB_0032543c;
      }
      if ((local_60.height != 0) && ((score1 < iVar5 || ((score1 == iVar5 && (score2 < iVar4)))))) {
        bestNode.x = local_60.x;
        bestNode.y = local_60.y;
        bestNode.width = local_60.width;
        bestNode.height = local_60.height;
        local_74 = index;
        local_70 = (uint)uVar6;
        iVar5 = score1;
        iVar4 = score2;
      }
      uVar3 = *(uint *)(rects + 0xc);
      local_60 = RVar1;
    }
    if (local_70 == 0xffffffff) {
      return;
    }
    bVar2 = DisjointRectCollection::Disjoint(this_00,&bestNode);
    if (!bVar2) break;
    DisjointRectCollection::Add(this_00,&bestNode);
    AddSkylineLevel(this,local_74,&bestNode);
    this->usedSurfaceArea =
         this->usedSurfaceArea +
         (long)*(int *)(*(long *)rects + 4 + (long)(int)local_70 * 8) *
         (long)*(int *)(*(long *)rects + (long)(int)local_70 * 8);
    TArray<RectSize,_RectSize>::Delete(rects,local_70);
    TArray<Rect,_Rect>::Push(local_50,&bestNode);
  }
  __assertion = "disjointRects.Disjoint(bestNode)";
  uVar3 = 0x5d;
LAB_0032543c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                ,uVar3,"void SkylineBinPack::Insert(TArray<RectSize> &, TArray<Rect> &)");
}

Assistant:

void SkylineBinPack::Insert(TArray<RectSize> &rects, TArray<Rect> &dst)
{
	dst.Clear();

	while(rects.Size() > 0)
	{
		Rect bestNode;
		int bestScore1 = INT_MAX;
		int bestScore2 = INT_MAX;
		int bestSkylineIndex = -1;
		int bestRectIndex = -1;
		for(unsigned i = 0; i < rects.Size(); ++i)
		{
			Rect newNode;
			int score1;
			int score2;
			int index;
			newNode = FindPositionForNewNodeMinWaste(rects[i].width, rects[i].height, score2, score1, index);
#ifdef _DEBUG
			assert(disjointRects.Disjoint(newNode));
#endif
			if (newNode.height != 0)
			{
				if (score1 < bestScore1 || (score1 == bestScore1 && score2 < bestScore2))
				{
					bestNode = newNode;
					bestScore1 = score1;
					bestScore2 = score2;
					bestSkylineIndex = index;
					bestRectIndex = i;
				}
			}
		}

		if (bestRectIndex == -1)
			return;

		// Perform the actual packing.
#ifdef _DEBUG
		assert(disjointRects.Disjoint(bestNode));
		disjointRects.Add(bestNode);
#endif
		AddSkylineLevel(bestSkylineIndex, bestNode);
		usedSurfaceArea += rects[bestRectIndex].width * rects[bestRectIndex].height;
		rects.Delete(bestRectIndex);
		dst.Push(bestNode);
	}
}